

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall
QList<QList<QGraphicsItem_*>_>::resize(QList<QList<QGraphicsItem_*>_> *this,qsizetype size)

{
  Data *pDVar1;
  long lVar2;
  QList<QGraphicsItem_*> *pQVar3;
  
  pDVar1 = (this->d).d;
  if (((pDVar1 == (Data *)0x0) ||
      (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     (((long)((long)(this->d).ptr -
             ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
      0x5555555555555555 + (pDVar1->super_QArrayData).alloc < size)) {
    QArrayDataPointer<QList<QGraphicsItem_*>_>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(QList<QGraphicsItem_*> **)0x0,
               (QArrayDataPointer<QList<QGraphicsItem_*>_> *)0x0);
  }
  else {
    lVar2 = (this->d).size;
    if (size < lVar2) {
      pQVar3 = (this->d).ptr;
      std::_Destroy_aux<false>::__destroy<QList<QGraphicsItem*>*>(pQVar3 + size,pQVar3 + lVar2);
      (this->d).size = size;
    }
  }
  lVar2 = (this->d).size;
  if (size - lVar2 != 0 && lVar2 <= size) {
    memset((this->d).ptr + lVar2,0,(((size - lVar2) * 0x18 - 0x18U) / 0x18) * 0x18 + 0x18);
    (this->d).size = size;
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }